

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::store_flattened_struct(CompilerGLSL *this,uint32_t lhs_id,uint32_t value)

{
  SPIRType *type;
  string basename;
  SmallVector<unsigned_int,_8UL> local_88;
  string local_50;
  
  type = Compiler::expression_type(&this->super_Compiler,lhs_id);
  to_flattened_access_chain_expression_abi_cxx11_(&local_50,this,lhs_id);
  local_88.super_VectorView<unsigned_int>.buffer_size = 0;
  local_88.buffer_capacity = 8;
  local_88.super_VectorView<unsigned_int>.ptr = (uint *)&local_88.stack_storage;
  store_flattened_struct(this,&local_50,value,type,&local_88);
  local_88.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)local_88.super_VectorView<unsigned_int>.ptr !=
      &local_88.stack_storage) {
    free(local_88.super_VectorView<unsigned_int>.ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::store_flattened_struct(uint32_t lhs_id, uint32_t value)
{
	auto &type = expression_type(lhs_id);
	auto basename = to_flattened_access_chain_expression(lhs_id);
	store_flattened_struct(basename, value, type, {});
}